

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O0

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy(string *tgtName,cmMakefile *mf)

{
  MessageType t;
  PolicyStatus PVar1;
  ostream *poVar2;
  PolicyID id;
  bool bVar3;
  string local_1f0;
  string local_1d0;
  MessageType local_19c;
  char *pcStack_198;
  MessageType messageType;
  char *modal;
  ostringstream e;
  cmMakefile *mf_local;
  string *tgtName_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
  pcStack_198 = (char *)0x0;
  local_19c = AUTHOR_WARNING;
  PVar1 = cmMakefile::GetPolicyStatus(mf,CMP0026,false);
  if (PVar1 != OLD) {
    if (PVar1 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)0x1a,id);
      poVar2 = std::operator<<((ostream *)&modal,(string *)&local_1d0);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_1d0);
      pcStack_198 = "should";
    }
    else if (PVar1 - NEW < 3) {
      pcStack_198 = "may";
      local_19c = FATAL_ERROR;
    }
  }
  if (pcStack_198 != (char *)0x0) {
    poVar2 = std::operator<<((ostream *)&modal,"The LOCATION property ");
    poVar2 = std::operator<<(poVar2,pcStack_198);
    poVar2 = std::operator<<(poVar2," not be read from target \"");
    poVar2 = std::operator<<(poVar2,(string *)tgtName);
    std::operator<<(poVar2,
                    "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
                   );
    t = local_19c;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(mf,t,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  bVar3 = local_19c != FATAL_ERROR;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
  return bVar3;
}

Assistant:

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy(
  std::string const& tgtName, cmMakefile const& mf)
{
  std::ostringstream e;
  const char* modal = nullptr;
  MessageType messageType = MessageType::AUTHOR_WARNING;
  switch (mf.GetPolicyStatus(cmPolicies::CMP0026)) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = MessageType::FATAL_ERROR;
      break;
  }

  if (modal) {
    e << "The LOCATION property " << modal << " not be read from target \""
      << tgtName
      << "\".  Use the target name directly with "
         "add_custom_command, or use the generator expression $<TARGET_FILE>, "
         "as appropriate.\n";
    mf.IssueMessage(messageType, e.str());
  }

  return messageType != MessageType::FATAL_ERROR;
}